

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

LClosure * getcached(Proto *p,UpVal **encup,StkId base)

{
  LClosure *pLVar1;
  lu_byte *plVar2;
  long lVar3;
  TValue *pTVar4;
  
  pLVar1 = p->cache;
  if ((pLVar1 != (LClosure *)0x0) && (0 < (long)p->sizeupvalues)) {
    plVar2 = &p->upvalues->idx;
    lVar3 = 0;
    do {
      if (plVar2[-1] == 0) {
        pTVar4 = encup[*plVar2]->v;
      }
      else {
        pTVar4 = base + *plVar2;
      }
      if (pLVar1->upvals[lVar3]->v != pTVar4) {
        return (LClosure *)0x0;
      }
      lVar3 = lVar3 + 1;
      plVar2 = plVar2 + 0x18;
    } while (p->sizeupvalues != lVar3);
  }
  return pLVar1;
}

Assistant:

static LClosure *getcached (Proto *p, UpVal **encup, StkId base) {
  LClosure *c = p->cache;
  if (c != NULL) {  /* is there a cached closure? */
    int nup = p->sizeupvalues;
    Upvaldesc *uv = p->upvalues;
    int i;
    for (i = 0; i < nup; i++) {  /* check whether it has right upvalues */
      TValue *v = uv[i].instack ? base + uv[i].idx : encup[uv[i].idx]->v;
      if (c->upvals[i]->v != v)
        return NULL;  /* wrong upvalue; cannot reuse closure */
    }
  }
  return c;  /* return cached closure (or NULL if no cached closure) */
}